

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O2

int check_command(GlobalVars *gv,char *name,uint32_t flags)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  _func_void_GlobalVars_ptr **pp_Var4;
  
  pp_Var4 = &ldCommands[0].cmdptr;
  while( true ) {
    if (((ScriptCmd *)(pp_Var4 + -2))->name == (char *)0x0) {
      return 0;
    }
    iVar2 = strcmp(((ScriptCmd *)(pp_Var4 + -2))->name,name);
    pcVar1 = scriptname;
    if (iVar2 == 0) break;
    pp_Var4 = pp_Var4 + 3;
  }
  uVar3 = *(uint *)(pp_Var4 + -1);
  if ((uVar3 & flags) == 0) {
    if (-1 < (short)flags) {
      uVar3 = getlineno();
      error(0x6b,pcVar1,(ulong)uVar3,name);
      uVar3 = *(uint *)(pp_Var4 + -1);
    }
    if ((uVar3 >> 0xd & 1) != 0) {
      skipblock(0,'(',')');
      uVar3 = *(uint *)(pp_Var4 + -1);
    }
    if ((uVar3 >> 0xe & 1) == 0) {
      return 1;
    }
    skip_expr(0);
    return 1;
  }
  if (*pp_Var4 != (_func_void_GlobalVars_ptr *)0x0) {
    (**pp_Var4)(gv);
    return 1;
  }
  uVar3 = getlineno();
  error(0x45,pcVar1,(ulong)uVar3,name);
  if (((ulong)*pp_Var4 & 0x2000) == 0) {
    return 1;
  }
  skipblock(0,'(',')');
  return 1;
}

Assistant:

static int check_command(struct GlobalVars *gv,char *name,uint32_t flags)
{
  struct ScriptCmd *scptr;

  for (scptr=ldCommands; scptr->name; scptr++) {
    if (!strcmp(scptr->name,name))
      break;
  }

  if (scptr->name) {
    if (scptr->flags & flags) {
      if (scptr->cmdptr) {
        scptr->cmdptr(gv);  /* execute linker-script command */
      }
      else {
        error(69,scriptname,getlineno(),name);  /* command ignored */
        if (scptr->flags & SCMDF_PAREN)
          skipblock(0,'(',')');
      }
    }
    else {
      if (!(flags & SCMDF_IGNORE)) {
        /* command not allowed outside SECTIONS block */
        error(107,scriptname,getlineno(),name);
      }
      if (scptr->flags & SCMDF_PAREN)
        skipblock(0,'(',')');
      if (scptr->flags & SCMDF_SEMIC)
        skip_expr(0);
    }
    return 1;
  }

  return 0;
}